

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

optional<long>
wallet::MaxInputWeight
          (Descriptor *desc,optional<CTxIn> *txin,CCoinControl *coin_control,bool tx_is_segwit,
          bool can_grind_r)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  byte extraout_var;
  _Storage<long,_true> _Var4;
  int extraout_var_01;
  long lVar5;
  _Storage<long,_true> _Var6;
  ulong uVar7;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  undefined3 in_register_00000081;
  long in_FS_OFFSET;
  optional<long> oVar9;
  int extraout_var_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if (CONCAT31(in_register_00000081,can_grind_r) != 0) {
    if (coin_control == (CCoinControl *)0x0) {
LAB_00509845:
      bVar2 = false;
    }
    else if (coin_control->fAllowWatchOnly == false) {
      if ((txin->super__Optional_base<CTxIn,_false,_false>)._M_payload.
          super__Optional_payload<CTxIn,_true,_false,_false>.super__Optional_payload_base<CTxIn>.
          _M_engaged != true) goto LAB_00509845;
      bVar2 = CCoinControl::IsExternalSelected(coin_control,(COutPoint *)txin);
    }
  }
  _Var4._0_4_ = (*desc->_vptr_Descriptor[0xd])(desc,(ulong)bVar2);
  _Var4._M_value._4_4_ = extraout_var_00;
  _Var6 = _Var4;
  if ((extraout_RDX & 1) != 0) {
    _Var6._0_4_ = (*desc->_vptr_Descriptor[0xe])(desc);
    _Var6._M_value._4_4_ = extraout_var_01;
    if ((extraout_RDX_00 & 1) != 0) {
      iVar3 = (*desc->_vptr_Descriptor[0xb])(desc);
      if ((extraout_var & iVar3 != 0) == 0) {
        _Var6._M_value = _Var4._M_value + 3;
        if (-1 < extraout_var_00) {
          _Var6 = _Var4;
        }
        uVar7 = _Var6._M_value >> 2;
        lVar5 = 0xa4;
        if ((0xfc < uVar7) && (lVar5 = 0xac, 0xffff < uVar7)) {
          lVar5 = (ulong)(uVar7 >> 0x20 != 0) * 0x10 + 0xb4;
        }
        uVar7 = (ulong)tx_is_segwit;
      }
      else {
        uVar7 = 1;
        lVar5 = 0xa4;
        if ((0xfc < (ulong)_Var6) && (uVar7 = 3, 0xffff < (ulong)_Var6)) {
          uVar7 = (ulong)(extraout_var_01 != 0) * 4 + 5;
        }
      }
      _Var6._M_value = lVar5 + uVar7 + _Var4._M_value;
      uVar8 = CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),1);
      goto LAB_00509905;
    }
  }
  uVar8 = 0;
LAB_00509905:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar8;
    oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var6._M_value;
    return (optional<long>)
           oVar9.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int64_t> MaxInputWeight(const Descriptor& desc, const std::optional<CTxIn>& txin,
                                             const CCoinControl* coin_control, const bool tx_is_segwit,
                                             const bool can_grind_r) {
    if (const auto sat_weight = desc.MaxSatisfactionWeight(!can_grind_r || UseMaxSig(txin, coin_control))) {
        if (const auto elems_count = desc.MaxSatisfactionElems()) {
            const bool is_segwit = IsSegwit(desc);
            // Account for the size of the scriptsig and the number of elements on the witness stack. Note
            // that if any input in the transaction is spending a witness program, we need to specify the
            // witness stack size for every input regardless of whether it is segwit itself.
            // NOTE: this also works in case of mixed scriptsig-and-witness such as in p2sh-wrapped segwit v0
            // outputs. In this case the size of the scriptsig length will always be one (since the redeemScript
            // is always a push of the witness program in this case, which is smaller than 253 bytes).
            const int64_t scriptsig_len = is_segwit ? 1 : GetSizeOfCompactSize(*sat_weight / WITNESS_SCALE_FACTOR);
            const int64_t witstack_len = is_segwit ? GetSizeOfCompactSize(*elems_count) : (tx_is_segwit ? 1 : 0);
            // previous txid + previous vout + sequence + scriptsig len + witstack size + scriptsig or witness
            // NOTE: sat_weight already accounts for the witness discount accordingly.
            return (32 + 4 + 4 + scriptsig_len) * WITNESS_SCALE_FACTOR + witstack_len + *sat_weight;
        }
    }

    return {};
}